

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

void __thiscall LinearNE<0,_1,_0>::wakeup(LinearNE<0,_1,_0> *this,int i,int param_2)

{
  int iVar1;
  
  if (i < this->sz) {
    Tint::operator=(&this->num_unfixed,(this->num_unfixed).v + -1);
    if (i < *(int *)&(this->super_Propagator).field_0x14) {
      iVar1 = ((this->x[i].var)->min).v;
    }
    else {
      iVar1 = -((this->y[i].var)->min).v;
    }
    Tint64_t::operator=(&this->sum_fixed,(this->sum_fixed).v + (long)iVar1);
  }
  if (1 < (this->num_unfixed).v) {
    return;
  }
  Propagator::pushInQueue(&this->super_Propagator);
  return;
}

Assistant:

void wakeup(int i, int /*c*/) override {
		if (i < sz) {
			num_unfixed = num_unfixed - 1;
			if (i < sp) {
				sum_fixed = sum_fixed + x[i].getVal();
			} else {
				sum_fixed = sum_fixed + y[i].getVal();
			}
		}
		if (num_unfixed > 1) {
			return;
		}
		if ((R == 0) || r.isTrue() || (!r.isFixed() && num_unfixed == 0)) {
			pushInQueue();
		}
	}